

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest12::verifyTexture
          (FunctionalTest12 *this,texture *texture,GLuint *expected_color)

{
  GLuint *pGVar1;
  pointer puVar2;
  GLuint y;
  ulong uVar3;
  long lVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> results;
  
  results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&results,0x400);
  Utils::texture::get(texture,0x8d99,0x1405,
                      results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  puVar2 = results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = 0; lVar4 = 0xc, uVar3 != 0x10; uVar3 = uVar3 + 1) {
    while (lVar4 + 0x10 != 0x11c) {
      if ((((*(GLuint *)((long)puVar2 + lVar4 + -0xc) != *expected_color) ||
           (*(GLuint *)((long)puVar2 + lVar4 + -8) != expected_color[1])) ||
          (*(GLuint *)((long)puVar2 + lVar4 + -4) != expected_color[2])) ||
         (pGVar1 = (GLuint *)((long)puVar2 + lVar4), lVar4 = lVar4 + 0x10,
         *pGVar1 != expected_color[3])) goto LAB_00a19f2c;
    }
    puVar2 = puVar2 + 0x40;
  }
LAB_00a19f2c:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&results.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return 0xf < uVar3;
}

Assistant:

bool FunctionalTest12::verifyTexture(Utils::texture& texture, const GLuint expected_color[4]) const
{
	std::vector<GLuint> results;
	results.resize(m_texture_width * m_texture_height * 4);

	texture.get(GL_RGBA_INTEGER, GL_UNSIGNED_INT, &results[0]);

	for (GLuint y = 0; y < m_texture_height; ++y)
	{
		const GLuint line_offset = y * m_texture_width * 4;

		for (GLuint x = 0; x < m_texture_width; ++x)
		{
			const GLuint point_offset = line_offset + x * 4;
			bool		 result		  = true;

			result = result && (results[point_offset + 0] == expected_color[0]);
			result = result && (results[point_offset + 1] == expected_color[1]);
			result = result && (results[point_offset + 2] == expected_color[2]);
			result = result && (results[point_offset + 3] == expected_color[3]);

			if (false == result)
			{
				return false;
			}
		}
	}

	return true;
}